

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::BayesianProbitRegressor::MergePartialFromCodedStream
          (BayesianProbitRegressor *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  ArenaStringPtr *this_01;
  ArenaStringPtr *this_02;
  ArenaStringPtr *this_03;
  ArenaStringPtr *this_04;
  ArenaStringPtr *this_05;
  ArenaStringPtr *this_06;
  ArenaStringPtr *this_07;
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  int iVar6;
  uint32 uVar7;
  Type *this_08;
  BayesianProbitRegressor_Gaussian *this_09;
  pair<int,_int> pVar8;
  int64 iVar9;
  char *field_name;
  char cVar10;
  uint uVar11;
  ulong uVar12;
  string *psVar13;
  pointer data;
  
  this_00 = &this->sampledprobabilityoutputfeaturename_;
  this_01 = &this->pessimisticprobabilityoutputfeaturename_;
  this_02 = &this->varianceoutputfeaturename_;
  this_03 = &this->meanoutputfeaturename_;
  this_04 = &this->samplingtruncationinputfeaturename_;
  this_05 = &this->samplingscaleinputfeaturename_;
  this_06 = &this->optimisminputfeaturename_;
  this_07 = &this->regressioninputfeaturename_;
LAB_0029e4b7:
  pbVar3 = input->buffer_;
  uVar7 = 0;
  if (pbVar3 < input->buffer_end_) {
    bVar2 = *pbVar3;
    uVar12 = (ulong)bVar2;
    pbVar1 = pbVar3 + 1;
    uVar11 = (uint)bVar2;
    if ((char)bVar2 < '\x01') {
      uVar7 = (uint)bVar2;
      if ((input->buffer_end_ <= pbVar1) || (uVar7 = uVar11, (~(uint)*pbVar1 & uVar11) < 0x80))
      goto LAB_0029e964;
      uVar12 = (ulong)((uVar11 + (uint)*pbVar1 * 0x80) - 0x80);
      input->buffer_ = pbVar3 + 2;
    }
    else {
      input->buffer_ = pbVar1;
    }
    uVar12 = uVar12 | 0x100000000;
  }
  else {
LAB_0029e964:
    uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
    uVar12 = 0;
    if (uVar7 - 1 < 0x3fff) {
      uVar12 = 0x100000000;
    }
    uVar12 = uVar7 | uVar12;
  }
  uVar7 = (uint32)uVar12;
  if ((uVar12 & 0x100000000) == 0) goto switchD_0029e555_caseD_4;
  cVar10 = (char)uVar12;
  switch((uint)(uVar12 >> 3) & 0x1fffffff) {
  case 1:
    if (cVar10 == '\b') {
      pbVar3 = input->buffer_;
      if (pbVar3 < input->buffer_end_) {
        bVar2 = *pbVar3;
        uVar7 = (uint32)bVar2;
        if (-1 < (char)bVar2) {
          this->numberoffeatures_ = (uint)bVar2;
          input->buffer_ = pbVar3 + 1;
          goto LAB_0029e4b7;
        }
      }
      else {
        uVar7 = 0;
      }
      iVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
      this->numberoffeatures_ = (uint32)iVar9;
      if (iVar9 < 0) {
        return false;
      }
      goto LAB_0029e4b7;
    }
    break;
  case 2:
    if (cVar10 != '\x12') break;
    this_09 = this->bias_;
    if (this_09 == (BayesianProbitRegressor_Gaussian *)0x0) {
      this_09 = (BayesianProbitRegressor_Gaussian *)operator_new(0x28);
      BayesianProbitRegressor_Gaussian::BayesianProbitRegressor_Gaussian(this_09);
      this->bias_ = this_09;
    }
    puVar4 = input->buffer_;
    if ((puVar4 < input->buffer_end_) && (iVar6 = (int)(char)*puVar4, -1 < (char)*puVar4)) {
      input->buffer_ = puVar4 + 1;
    }
    else {
      iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
      if (iVar6 < 0) {
        return false;
      }
    }
    pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar6)
    ;
    if ((long)pVar8 < 0) {
      return false;
    }
    bVar5 = BayesianProbitRegressor_Gaussian::MergePartialFromCodedStream(this_09,input);
LAB_0029e950:
    if (bVar5 == false) {
      return false;
    }
    bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                      (input,pVar8.first);
    goto LAB_0029e535;
  case 3:
    if (cVar10 == '\x1a') {
      this_08 = google::protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>::TypeHandler>
                          (&(this->features_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (iVar6 = (int)(char)*puVar4, -1 < (char)*puVar4)) {
        input->buffer_ = puVar4 + 1;
      }
      else {
        iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar6 < 0) {
          return false;
        }
      }
      pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,iVar6);
      if ((long)pVar8 < 0) {
        return false;
      }
      bVar5 = BayesianProbitRegressor_FeatureWeight::MergePartialFromCodedStream(this_08,input);
      goto LAB_0029e950;
    }
    break;
  case 10:
    if (cVar10 != 'R') break;
    psVar13 = this_07->ptr_;
    if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (this_07,(string *)
                         &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
      psVar13 = this_07->ptr_;
    }
    bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
    if (!bVar5) {
      return false;
    }
    data = (this_07->ptr_->_M_dataplus)._M_p;
    iVar6 = (int)this_07->ptr_->_M_string_length;
    field_name = "CoreML.Specification.BayesianProbitRegressor.regressionInputFeatureName";
LAB_0029e8e2:
    bVar5 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                      (data,iVar6,PARSE,field_name);
    if (!bVar5) {
      return false;
    }
    goto LAB_0029e4b7;
  case 0xb:
    if (cVar10 == 'Z') {
      psVar13 = this_06->ptr_;
      if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_06,(string *)
                           &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        psVar13 = this_06->ptr_;
      }
      bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
      if (!bVar5) {
        return false;
      }
      data = (this_06->ptr_->_M_dataplus)._M_p;
      iVar6 = (int)this_06->ptr_->_M_string_length;
      field_name = "CoreML.Specification.BayesianProbitRegressor.optimismInputFeatureName";
      goto LAB_0029e8e2;
    }
    break;
  case 0xc:
    if (cVar10 == 'b') {
      psVar13 = this_05->ptr_;
      if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_05,(string *)
                           &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        psVar13 = this_05->ptr_;
      }
      bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
      if (!bVar5) {
        return false;
      }
      data = (this_05->ptr_->_M_dataplus)._M_p;
      iVar6 = (int)this_05->ptr_->_M_string_length;
      field_name = "CoreML.Specification.BayesianProbitRegressor.samplingScaleInputFeatureName";
      goto LAB_0029e8e2;
    }
    break;
  case 0xd:
    if (cVar10 == 'j') {
      psVar13 = this_04->ptr_;
      if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_04,(string *)
                           &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        psVar13 = this_04->ptr_;
      }
      bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
      if (!bVar5) {
        return false;
      }
      data = (this_04->ptr_->_M_dataplus)._M_p;
      iVar6 = (int)this_04->ptr_->_M_string_length;
      field_name = "CoreML.Specification.BayesianProbitRegressor.samplingTruncationInputFeatureName"
      ;
      goto LAB_0029e8e2;
    }
    break;
  case 0x14:
    if (cVar10 == -0x5e) {
      psVar13 = this_03->ptr_;
      if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_03,(string *)
                           &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        psVar13 = this_03->ptr_;
      }
      bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
      if (!bVar5) {
        return false;
      }
      data = (this_03->ptr_->_M_dataplus)._M_p;
      iVar6 = (int)this_03->ptr_->_M_string_length;
      field_name = "CoreML.Specification.BayesianProbitRegressor.meanOutputFeatureName";
      goto LAB_0029e8e2;
    }
    break;
  case 0x15:
    if (cVar10 == -0x56) {
      psVar13 = this_02->ptr_;
      if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_02,(string *)
                           &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        psVar13 = this_02->ptr_;
      }
      bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
      if (!bVar5) {
        return false;
      }
      data = (this_02->ptr_->_M_dataplus)._M_p;
      iVar6 = (int)this_02->ptr_->_M_string_length;
      field_name = "CoreML.Specification.BayesianProbitRegressor.varianceOutputFeatureName";
      goto LAB_0029e8e2;
    }
    break;
  case 0x16:
    if (cVar10 == -0x4e) {
      psVar13 = this_01->ptr_;
      if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_01,(string *)
                           &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        psVar13 = this_01->ptr_;
      }
      bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
      if (!bVar5) {
        return false;
      }
      data = (this_01->ptr_->_M_dataplus)._M_p;
      iVar6 = (int)this_01->ptr_->_M_string_length;
      field_name = 
      "CoreML.Specification.BayesianProbitRegressor.pessimisticProbabilityOutputFeatureName";
      goto LAB_0029e8e2;
    }
    break;
  case 0x17:
    if (cVar10 == -0x46) {
      psVar13 = this_00->ptr_;
      if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_00,(string *)
                           &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        psVar13 = this_00->ptr_;
      }
      bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
      if (!bVar5) {
        return false;
      }
      data = (this_00->ptr_->_M_dataplus)._M_p;
      iVar6 = (int)this_00->ptr_->_M_string_length;
      field_name = 
      "CoreML.Specification.BayesianProbitRegressor.sampledProbabilityOutputFeatureName";
      goto LAB_0029e8e2;
    }
  }
switchD_0029e555_caseD_4:
  if (uVar7 == 0) {
    return true;
  }
  if ((uVar7 & 7) == 4) {
    return true;
  }
  bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar7);
LAB_0029e535:
  if (bVar5 == false) {
    return false;
  }
  goto LAB_0029e4b7;
}

Assistant:

bool BayesianProbitRegressor::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.BayesianProbitRegressor)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint32 numberOfFeatures = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &numberoffeatures_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.BayesianProbitRegressor.Gaussian bias = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bias()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.BayesianProbitRegressor.FeatureWeight features = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_features()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string regressionInputFeatureName = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_regressioninputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->regressioninputfeaturename().data(), this->regressioninputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.regressionInputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string optimismInputFeatureName = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(90u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_optimisminputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->optimisminputfeaturename().data(), this->optimisminputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.optimismInputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string samplingScaleInputFeatureName = 12;
      case 12: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(98u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_samplingscaleinputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->samplingscaleinputfeaturename().data(), this->samplingscaleinputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.samplingScaleInputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string samplingTruncationInputFeatureName = 13;
      case 13: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(106u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_samplingtruncationinputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->samplingtruncationinputfeaturename().data(), this->samplingtruncationinputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.samplingTruncationInputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string meanOutputFeatureName = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_meanoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->meanoutputfeaturename().data(), this->meanoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.meanOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string varianceOutputFeatureName = 21;
      case 21: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(170u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_varianceoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->varianceoutputfeaturename().data(), this->varianceoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.varianceOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string pessimisticProbabilityOutputFeatureName = 22;
      case 22: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(178u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_pessimisticprobabilityoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->pessimisticprobabilityoutputfeaturename().data(), this->pessimisticprobabilityoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.pessimisticProbabilityOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string sampledProbabilityOutputFeatureName = 23;
      case 23: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(186u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_sampledprobabilityoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->sampledprobabilityoutputfeaturename().data(), this->sampledprobabilityoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.sampledProbabilityOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.BayesianProbitRegressor)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.BayesianProbitRegressor)
  return false;
#undef DO_
}